

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelLoader.cpp
# Opt level: O2

bool __thiscall
iDynTree::ModelLoader::loadModelFromFile
          (ModelLoader *this,string *filename,string *param_2,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *packageDirs)

{
  _Head_base<0UL,_iDynTree::ModelLoader::ModelLoaderPimpl_*,_false> this_00;
  element_type *peVar1;
  char cVar2;
  bool bVar3;
  ModelParserOptions *this_01;
  Model *_model;
  shared_ptr<iDynTree::XMLParser> parser;
  shared_ptr<const_iDynTree::XMLDocument> document;
  _Any_data local_d8;
  code *local_c8;
  code *pcStack_c0;
  shared_ptr<const_iDynTree::URDFDocument> urdfDocument;
  string local_a0 [32];
  anon_class_40_1_197c2f9f documentFactoryWithOptions;
  ModelParserOptions parserOptions;
  
  std::make_shared<iDynTree::XMLParser>();
  ModelParserOptions::ModelParserOptions
            (&parserOptions,
             &((this->m_pimpl)._M_t.
               super___uniq_ptr_impl<iDynTree::ModelLoader::ModelLoaderPimpl,_std::default_delete<iDynTree::ModelLoader::ModelLoaderPimpl>_>
               ._M_t.
               super__Tuple_impl<0UL,_iDynTree::ModelLoader::ModelLoaderPimpl_*,_std::default_delete<iDynTree::ModelLoader::ModelLoaderPimpl>_>
               .super__Head_base<0UL,_iDynTree::ModelLoader::ModelLoaderPimpl_*,_false>._M_head_impl
              )->m_options);
  ModelParserOptions::ModelParserOptions(&documentFactoryWithOptions.parserOptions,&parserOptions);
  peVar1 = parser.super___shared_ptr<iDynTree::XMLParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_c8 = (code *)0x0;
  pcStack_c0 = (code *)0x0;
  this_01 = (ModelParserOptions *)operator_new(0x28);
  ModelParserOptions::ModelParserOptions(this_01,&documentFactoryWithOptions.parserOptions);
  pcStack_c0 = std::
               _Function_handler<std::shared_ptr<iDynTree::XMLDocument>_(iDynTree::XMLParserState_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/robotology[P]idyntree/src/model_io/codecs/src/ModelLoader.cpp:85:43)>
               ::_M_invoke;
  local_c8 = std::
             _Function_handler<std::shared_ptr<iDynTree::XMLDocument>_(iDynTree::XMLParserState_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/robotology[P]idyntree/src/model_io/codecs/src/ModelLoader.cpp:85:43)>
             ::_M_manager;
  local_d8._M_unused._M_object = this_01;
  iDynTree::XMLParser::setDocumentFactory(peVar1);
  std::_Function_base::~_Function_base((_Function_base *)&local_d8);
  iDynTree::XMLParser::setPackageDirs
            ((vector *)
             parser.super___shared_ptr<iDynTree::XMLParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::string(local_a0,(string *)filename);
  cVar2 = iDynTree::XMLParser::parseXMLFile
                    (parser.super___shared_ptr<iDynTree::XMLParser,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,local_a0);
  std::__cxx11::string::~string(local_a0);
  if (cVar2 == '\0') {
    iDynTree::reportError("ModelLoader","loadModelFromFile","Error in parsing model from URDF.");
    bVar3 = false;
  }
  else {
    iDynTree::XMLParser::document();
    std::dynamic_pointer_cast<iDynTree::URDFDocument_const,iDynTree::XMLDocument_const>
              ((shared_ptr<const_iDynTree::XMLDocument> *)&urdfDocument);
    if (urdfDocument.super___shared_ptr<const_iDynTree::URDFDocument,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      iDynTree::reportError
                ("ModelLoader","loadModelFromFile","Fatal error in retrieving the parsed model.");
      bVar3 = false;
    }
    else {
      this_00._M_head_impl =
           (this->m_pimpl)._M_t.
           super___uniq_ptr_impl<iDynTree::ModelLoader::ModelLoaderPimpl,_std::default_delete<iDynTree::ModelLoader::ModelLoaderPimpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_iDynTree::ModelLoader::ModelLoaderPimpl_*,_std::default_delete<iDynTree::ModelLoader::ModelLoaderPimpl>_>
           .super__Head_base<0UL,_iDynTree::ModelLoader::ModelLoaderPimpl_*,_false>._M_head_impl;
      _model = URDFDocument::model(urdfDocument.
                                   super___shared_ptr<const_iDynTree::URDFDocument,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
      bVar3 = ModelLoaderPimpl::setModel(this_00._M_head_impl,_model);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&urdfDocument.
                super___shared_ptr<const_iDynTree::URDFDocument,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&document.super___shared_ptr<const_iDynTree::XMLDocument,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  std::__cxx11::string::~string
            ((string *)&documentFactoryWithOptions.parserOptions.originalFilename);
  std::__cxx11::string::~string((string *)&parserOptions.originalFilename);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parser.super___shared_ptr<iDynTree::XMLParser,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return bVar3;
}

Assistant:

bool ModelLoader::loadModelFromFile(const std::string& filename,
                                        const std::string& /*filetype*/,
                                        const std::vector<std::string>& packageDirs /* = {} */)
    {
        // Allocate parser
        std::shared_ptr<XMLParser> parser = std::make_shared<XMLParser>();
        auto parserOptions =  this->m_pimpl->m_options;
        auto documentFactoryWithOptions = [parserOptions](XMLParserState& state){
            return std::shared_ptr<XMLDocument>(new URDFDocument(state, parserOptions));
            };
        parser->setDocumentFactory(documentFactoryWithOptions);
        parser->setPackageDirs(packageDirs);
        if (!parser->parseXMLFile(filename)) {
            reportError("ModelLoader", "loadModelFromFile", "Error in parsing model from URDF.");
            return false;
        }
        // Retrieving the parsed document, which is an instance of URDFDocument
        std::shared_ptr<const XMLDocument> document = parser->document();
        std::shared_ptr<const URDFDocument> urdfDocument = std::dynamic_pointer_cast<const URDFDocument>(document);
        if (!urdfDocument) {
            reportError("ModelLoader", "loadModelFromFile", "Fatal error in retrieving the parsed model.");
            return false;
        }

        return m_pimpl->setModel(urdfDocument->model());
    }